

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

int fmt::v7::detail::snprintf_float<long_double>
              (longdouble value,int precision,float_specs specs,buffer<char> *buf)

{
  char *pcVar1;
  char cVar2;
  size_t sVar3;
  int iVar4;
  uint uVar5;
  undefined2 *puVar6;
  long lVar7;
  byte bVar8;
  byte bVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  char *__s;
  char local_3b;
  undefined1 local_3a [2];
  undefined1 auStack_38 [4];
  uint uStack_34;
  char format [7];
  
  if (buf->capacity_ <= buf->size_) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
                ,0x47e,"empty buffer");
  }
  uVar10 = 5;
  if (-1 < precision) {
    uVar10 = precision - 1;
  }
  bVar9 = specs._4_1_;
  uVar14 = (ulong)uVar10;
  if (1 < bVar9) {
    uVar14 = (ulong)(uint)precision;
  }
  local_3b = '%';
  uVar10 = specs._4_4_;
  if (bVar9 == 3 && (uVar10 >> 0x14 & 1) != 0) {
    puVar6 = (undefined2 *)(local_3a + 1);
    local_3a[0] = 0x23;
  }
  else {
    puVar6 = (undefined2 *)local_3a;
  }
  uStack_34 = (uint)uVar14;
  if (-1 < (int)uStack_34) {
    *puVar6 = 0x2a2e;
    puVar6 = puVar6 + 1;
  }
  *(undefined1 *)puVar6 = 0x4c;
  if (bVar9 == 3) {
    bVar8 = ((uVar10 >> 0x10 & 1) == 0) << 5 | 0x41;
  }
  else {
    bVar8 = (bVar9 == 2) + 0x65;
  }
  *(byte *)((long)puVar6 + 1) = bVar8;
  *(undefined1 *)(puVar6 + 1) = 0;
  sVar3 = buf->size_;
LAB_00234445:
  while( true ) {
    __s = buf->ptr_ + sVar3;
    uVar13 = buf->capacity_ - sVar3;
    if ((int)uVar14 < 0) {
      uVar5 = snprintf(__s,uVar13,&local_3b);
    }
    else {
      uVar5 = snprintf(__s,uVar13,&local_3b,uVar14);
    }
    uVar12 = (ulong)uVar5;
    if ((int)uVar5 < 0) goto LAB_002344b4;
    if (uVar12 < uVar13) break;
    uVar12 = sVar3 + 1 + uVar12;
    uVar14 = (ulong)uStack_34;
    if (buf->capacity_ < uVar12) goto LAB_002344c5;
  }
  if (bVar9 == 2) {
    if (precision != 0) {
      uVar14 = 1;
      do {
        lVar7 = uVar14 + (uVar12 - 2);
        uVar14 = uVar14 - 1;
      } while ((byte)(__s[lVar7] - 0x30U) < 10);
      if (0 < (int)uVar14) {
LAB_002346cc:
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/core.h"
                    ,0x13c,"negative value");
      }
      memmove(__s + uVar14 + uVar12 + -1,__s + uVar14 + uVar12,(ulong)(-(int)uVar14 & 0x7fffffff));
      uVar12 = (ulong)(uVar5 - 1);
      uVar13 = buf->capacity_;
      if (uVar13 < uVar12) {
        (**buf->_vptr_buffer)(buf,uVar12);
        uVar13 = buf->capacity_;
      }
      if (uVar13 < uVar12) {
        uVar12 = uVar13;
      }
      buf->size_ = uVar12;
      goto LAB_00234683;
    }
    uVar14 = buf->capacity_;
    if (uVar14 < uVar12) {
      (**buf->_vptr_buffer)(buf,uVar12);
      uVar14 = buf->capacity_;
    }
    if (uVar12 <= uVar14) {
      uVar14 = uVar12;
    }
    buf->size_ = uVar14;
  }
  else {
    if ((uVar10 & 0xff) != 3) {
      lVar7 = -2;
      uVar14 = uVar12 - 1;
      do {
        uVar13 = uVar14;
        lVar7 = lVar7 + 1;
        uVar14 = uVar13 - 1;
      } while (__s[uVar13] != 'e');
      cVar2 = __s[uVar13 + 1];
      if ((cVar2 != '+') && (cVar2 != '-')) {
        __assert_fail("sign == \'+\' || sign == \'-\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
                      ,0x4cc,
                      "int fmt::detail::snprintf_float(T, int, float_specs, buffer<char> &) [T = long double]"
                     );
      }
      lVar7 = -lVar7;
      iVar11 = 0;
      do {
        if (9 < (byte)(__s[lVar7 + uVar12] - 0x30U)) {
          __assert_fail("is_digit(*p)",
                        "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
                        ,0x4d0,
                        "int fmt::detail::snprintf_float(T, int, float_specs, buffer<char> &) [T = long double]"
                       );
        }
        iVar11 = (uint)(byte)__s[lVar7 + uVar12] + iVar11 * 10 + -0x30;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0);
      iVar4 = -iVar11;
      if (cVar2 != '-') {
        iVar4 = iVar11;
      }
      if (uVar14 == 0) {
        uVar14 = 0;
      }
      else {
        do {
          pcVar1 = __s + uVar14;
          uVar14 = uVar14 - 1;
        } while (*pcVar1 == '0');
        if ((int)(uint)uVar14 < 0) goto LAB_002346cc;
        memmove(__s + 1,__s + 2,(ulong)((uint)uVar14 & 0x7fffffff));
      }
      uVar12 = sVar3 + 1 + (uVar14 & 0xffffffff);
      uVar13 = buf->capacity_;
      if (uVar13 < uVar12) {
        (**buf->_vptr_buffer)(buf,uVar12);
        uVar13 = buf->capacity_;
      }
      if (uVar13 < uVar12) {
        uVar12 = uVar13;
      }
      buf->size_ = uVar12;
      uVar14 = (ulong)(uint)(iVar4 - (int)uVar14);
      goto LAB_00234683;
    }
    uVar12 = sVar3 + uVar12;
    uVar14 = buf->capacity_;
    if (uVar14 < uVar12) {
      (**buf->_vptr_buffer)(buf,uVar12);
      uVar14 = buf->capacity_;
    }
    if (uVar14 < uVar12) {
      uVar12 = uVar14;
    }
    buf->size_ = uVar12;
  }
  uVar14 = 0;
LAB_00234683:
  return (int)uVar14;
LAB_002344b4:
  uVar14 = (ulong)uStack_34;
  if (buf->capacity_ != 0xffffffffffffffff) {
    uVar12 = buf->capacity_ + 1;
LAB_002344c5:
    uVar14 = (ulong)uStack_34;
    (**buf->_vptr_buffer)(buf,uVar12);
  }
  goto LAB_00234445;
}

Assistant:

int snprintf_float(T value, int precision, float_specs specs,
                   buffer<char>& buf) {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buf.capacity() > buf.size(), "empty buffer");
  static_assert(!std::is_same<T, float>::value, "");

  // Subtract 1 to account for the difference in precision since we use %e for
  // both general and exponent format.
  if (specs.format == float_format::general ||
      specs.format == float_format::exp)
    precision = (precision >= 0 ? precision : 6) - 1;

  // Build the format string.
  enum { max_format_size = 7 };  // The longest format is "%#.*Le".
  char format[max_format_size];
  char* format_ptr = format;
  *format_ptr++ = '%';
  if (specs.showpoint && specs.format == float_format::hex) *format_ptr++ = '#';
  if (precision >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }
  if (std::is_same<T, long double>()) *format_ptr++ = 'L';
  *format_ptr++ = specs.format != float_format::hex
                      ? (specs.format == float_format::fixed ? 'f' : 'e')
                      : (specs.upper ? 'A' : 'a');
  *format_ptr = '\0';

  // Format using snprintf.
  auto offset = buf.size();
  for (;;) {
    auto begin = buf.data() + offset;
    auto capacity = buf.capacity() - offset;
#ifdef FMT_FUZZ
    if (precision > 100000)
      throw std::runtime_error(
          "fuzz mode - avoid large allocation inside snprintf");
#endif
    // Suppress the warning about a nonliteral format string.
    // Cannot use auto because of a bug in MinGW (#1532).
    int (*snprintf_ptr)(char*, size_t, const char*, ...) = FMT_SNPRINTF;
    int result = precision >= 0
                     ? snprintf_ptr(begin, capacity, format, precision, value)
                     : snprintf_ptr(begin, capacity, format, value);
    if (result < 0) {
      // The buffer will grow exponentially.
      buf.try_reserve(buf.capacity() + 1);
      continue;
    }
    auto size = to_unsigned(result);
    // Size equal to capacity means that the last character was truncated.
    if (size >= capacity) {
      buf.try_reserve(size + offset + 1);  // Add 1 for the terminating '\0'.
      continue;
    }
    auto is_digit = [](char c) { return c >= '0' && c <= '9'; };
    if (specs.format == float_format::fixed) {
      if (precision == 0) {
        buf.try_resize(size);
        return 0;
      }
      // Find and remove the decimal point.
      auto end = begin + size, p = end;
      do {
        --p;
      } while (is_digit(*p));
      int fraction_size = static_cast<int>(end - p - 1);
      std::memmove(p, p + 1, to_unsigned(fraction_size));
      buf.try_resize(size - 1);
      return -fraction_size;
    }
    if (specs.format == float_format::hex) {
      buf.try_resize(size + offset);
      return 0;
    }
    // Find and parse the exponent.
    auto end = begin + size, exp_pos = end;
    do {
      --exp_pos;
    } while (*exp_pos != 'e');
    char sign = exp_pos[1];
    assert(sign == '+' || sign == '-');
    int exp = 0;
    auto p = exp_pos + 2;  // Skip 'e' and sign.
    do {
      assert(is_digit(*p));
      exp = exp * 10 + (*p++ - '0');
    } while (p != end);
    if (sign == '-') exp = -exp;
    int fraction_size = 0;
    if (exp_pos != begin + 1) {
      // Remove trailing zeros.
      auto fraction_end = exp_pos - 1;
      while (*fraction_end == '0') --fraction_end;
      // Move the fractional part left to get rid of the decimal point.
      fraction_size = static_cast<int>(fraction_end - begin - 1);
      std::memmove(begin + 1, begin + 2, to_unsigned(fraction_size));
    }
    buf.try_resize(to_unsigned(fraction_size) + offset + 1);
    return exp - fraction_size;
  }
}